

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_cwksp.h
# Opt level: O0

void * ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp *ws,size_t bytes)

{
  ZSTD_cwksp *pZVar1;
  void *bottom;
  void *alloc;
  size_t bytes_local;
  ZSTD_cwksp *ws_local;
  
  ws_local = (ZSTD_cwksp *)((long)ws->allocStart - bytes);
  pZVar1 = (ZSTD_cwksp *)ws->tableEnd;
  ZSTD_cwksp_assert_internal_consistency(ws);
  if (ws_local < pZVar1) {
    ws->allocFailed = '\x01';
    ws_local = (ZSTD_cwksp *)0x0;
  }
  else {
    if (ws_local < (ZSTD_cwksp *)ws->tableValidEnd) {
      ws->tableValidEnd = ws_local;
    }
    ws->allocStart = ws_local;
  }
  return ws_local;
}

Assistant:

MEM_STATIC void* ZSTD_cwksp_reserve_internal_buffer_space(ZSTD_cwksp* ws, size_t const bytes) {
    void* const alloc = (BYTE*)ws->allocStart - bytes;
    void* const bottom = ws->tableEnd;
    DEBUGLOG(5, "cwksp: reserving %p %zd bytes, %zd bytes remaining",
        alloc, bytes, ZSTD_cwksp_available_space(ws) - bytes);
    ZSTD_cwksp_assert_internal_consistency(ws);
    assert(alloc >= bottom);
    if (alloc < bottom) {
        DEBUGLOG(4, "cwksp: alloc failed!");
        ws->allocFailed = 1;
        return NULL;
    }
    if (alloc < ws->tableValidEnd) {
        ws->tableValidEnd = alloc;
    }
    ws->allocStart = alloc;
    return alloc;
}